

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Initialize(void)

{
  int *piVar1;
  ImGuiViewportP **ppIVar2;
  char *pcVar3;
  ImGuiContext *pIVar4;
  int n;
  ImGuiID IVar5;
  ImGuiViewportP *pIVar6;
  ImGuiViewportP **__dest;
  char *__dest_00;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ImGuiSettingsHandler ini_handler;
  ImGuiSettingsHandler local_68;
  
  pIVar4 = GImGui;
  if ((GImGui->Initialized == false) && (GImGui->SettingsLoaded != true)) {
    local_68.TypeHash = 0;
    local_68._12_4_ = 0;
    local_68.ApplyAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    local_68.WriteAllFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
    local_68.ReadOpenFn = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
    local_68.ReadLineFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
    local_68.ClearAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    local_68.ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    local_68.UserData = (void *)0x0;
    local_68.TypeName = "Window";
    IVar5 = ImHashStr("Window",0,0);
    local_68.TypeHash = IVar5;
    local_68.ClearAllFn = WindowSettingsHandler_ClearAll;
    local_68.ReadOpenFn = WindowSettingsHandler_ReadOpen;
    local_68.ReadLineFn = WindowSettingsHandler_ReadLine;
    local_68.ApplyAllFn = WindowSettingsHandler_ApplyAll;
    local_68.WriteAllFn = WindowSettingsHandler_WriteAll;
    AddSettingsHandler(&local_68);
    TableSettingsAddSettingsHandler();
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar6 = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0xb8,GImAllocatorUserData);
    (pIVar6->super_ImGuiViewport).Flags = 0;
    (pIVar6->super_ImGuiViewport).Pos.x = 0.0;
    *(undefined8 *)&(pIVar6->super_ImGuiViewport).Pos.y = 0;
    *(undefined8 *)&(pIVar6->super_ImGuiViewport).Size.y = 0;
    *(undefined8 *)&(pIVar6->super_ImGuiViewport).WorkPos.y = 0;
    *(undefined8 *)&(pIVar6->super_ImGuiViewport).WorkSize.y = 0;
    (pIVar6->super_ImGuiViewport).PlatformHandleRaw = (void *)0x0;
    (pIVar6->DrawDataP).Valid = false;
    *(undefined3 *)&(pIVar6->DrawDataP).field_0x1 = 0;
    (pIVar6->DrawDataP).CmdListsCount = 0;
    (pIVar6->DrawDataP).TotalIdxCount = 0;
    (pIVar6->DrawDataP).TotalVtxCount = 0;
    (pIVar6->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar6->DrawDataP).DisplayPos.x = 0.0;
    (pIVar6->DrawDataP).DisplayPos.y = 0.0;
    (pIVar6->DrawDataP).DisplaySize.x = 0.0;
    (pIVar6->DrawDataP).DisplaySize.y = 0.0;
    (pIVar6->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar6->DrawDataP).FramebufferScale.y = 0.0;
    (pIVar6->DrawDataBuilder).Layers[0].Size = 0;
    (pIVar6->DrawDataBuilder).Layers[0].Capacity = 0;
    (pIVar6->DrawDataBuilder).Layers[0].Data = (ImDrawList **)0x0;
    (pIVar6->DrawDataBuilder).Layers[1].Size = 0;
    (pIVar6->DrawDataBuilder).Layers[1].Capacity = 0;
    (pIVar6->DrawDataBuilder).Layers[1].Data = (ImDrawList **)0x0;
    (pIVar6->WorkOffsetMin).x = 0.0;
    (pIVar6->WorkOffsetMin).y = 0.0;
    (pIVar6->WorkOffsetMax).x = 0.0;
    (pIVar6->WorkOffsetMax).y = 0.0;
    (pIVar6->BuildWorkOffsetMin).x = 0.0;
    (pIVar6->BuildWorkOffsetMin).y = 0.0;
    (pIVar6->BuildWorkOffsetMax).x = 0.0;
    (pIVar6->BuildWorkOffsetMax).y = 0.0;
    pIVar6->DrawListsLastFrame[0] = -1;
    pIVar6->DrawListsLastFrame[1] = -1;
    pIVar6->DrawLists[0] = (ImDrawList *)0x0;
    pIVar6->DrawLists[1] = (ImDrawList *)0x0;
    iVar10 = (pIVar4->Viewports).Size;
    iVar9 = (pIVar4->Viewports).Capacity;
    if (iVar10 == iVar9) {
      iVar10 = iVar10 + 1;
      if (iVar9 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar9 / 2 + iVar9;
      }
      if (iVar10 < iVar8) {
        iVar10 = iVar8;
      }
      if (iVar9 < iVar10) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiViewportP **)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData)
        ;
        ppIVar2 = (pIVar4->Viewports).Data;
        if (ppIVar2 != (ImGuiViewportP **)0x0) {
          memcpy(__dest,ppIVar2,(long)(pIVar4->Viewports).Size << 3);
          ppIVar2 = (pIVar4->Viewports).Data;
          if ((ppIVar2 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
        }
        (pIVar4->Viewports).Data = __dest;
        (pIVar4->Viewports).Capacity = iVar10;
      }
    }
    (pIVar4->Viewports).Data[(pIVar4->Viewports).Size] = pIVar6;
    (pIVar4->Viewports).Size = (pIVar4->Viewports).Size + 1;
    iVar10 = (pIVar4->TempBuffer).Capacity;
    if (iVar10 < 0xc01) {
      if (iVar10 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar10 / 2 + iVar10;
      }
      iVar8 = 0xc01;
      if (0xc01 < iVar9) {
        iVar8 = iVar9;
      }
      if (iVar10 < iVar8) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest_00 = (char *)(*GImAllocatorAllocFunc)((size_t)iVar8,GImAllocatorUserData);
        pcVar3 = (pIVar4->TempBuffer).Data;
        if (pcVar3 != (char *)0x0) {
          memcpy(__dest_00,pcVar3,(long)(pIVar4->TempBuffer).Size);
          pcVar3 = (pIVar4->TempBuffer).Data;
          if ((pcVar3 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
        }
        (pIVar4->TempBuffer).Data = __dest_00;
        (pIVar4->TempBuffer).Capacity = iVar8;
      }
    }
    lVar7 = (long)(pIVar4->TempBuffer).Size;
    if (lVar7 < 0xc01) {
      do {
        (pIVar4->TempBuffer).Data[lVar7] = '\0';
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0xc01);
    }
    (pIVar4->TempBuffer).Size = 0xc01;
    pIVar4->Initialized = true;
    return;
  }
  __assert_fail("!g.Initialized && !g.SettingsLoaded",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                ,0x1195,"void ImGui::Initialize()");
}

Assistant:

void ImGui::Initialize()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        AddSettingsHandler(&ini_handler);
    }

    // Add .ini handle for ImGuiTable type
    TableSettingsAddSettingsHandler();

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);
    g.TempBuffer.resize(1024 * 3 + 1, 0);

#ifdef IMGUI_HAS_DOCK
#endif

    g.Initialized = true;
}